

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs.c
# Opt level: O2

void lwsl_hexdump_level(int hexdump_level,void *vbuf,size_t len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  char cVar5;
  uint uVar6;
  char *pcVar7;
  bool bVar8;
  char line [80];
  
  if ((log_level & hexdump_level) != 0) {
    if (len == 0) {
      _lws_log(hexdump_level,"(hexdump: zero length)\n");
      return;
    }
    if (vbuf == (void *)0x0) {
      _lws_log(hexdump_level,"(hexdump: trying to dump %d at NULL)\n",len & 0xffffffff);
      return;
    }
    _lws_log(hexdump_level,"\n");
    uVar1 = 0;
    while (uVar1 < len) {
      iVar2 = lws_snprintf(line,10,"%04X: ");
      pcVar7 = line + iVar2;
      iVar2 = 0x10;
      for (uVar6 = 0; (uVar6 < 0x10 && (uVar1 + uVar6 < len)); uVar6 = uVar6 + 1) {
        iVar3 = lws_snprintf(pcVar7,5,"%02X ");
        pcVar7 = pcVar7 + iVar3;
        iVar2 = iVar2 + -1;
      }
      while (bVar8 = iVar2 != 0, iVar2 = iVar2 + -1, bVar8) {
        iVar3 = lws_snprintf(pcVar7,5,"   ");
        pcVar7 = pcVar7 + iVar3;
      }
      iVar2 = lws_snprintf(pcVar7,6,"   ");
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        iVar3 = (int)lVar4;
        if (len <= uVar1 + iVar3) goto LAB_00104bd8;
        cVar5 = *(char *)((long)vbuf + (ulong)(uVar1 + iVar3));
        if (0x5e < (byte)(cVar5 - 0x20U)) {
          cVar5 = '.';
        }
        pcVar7[lVar4 + iVar2] = cVar5;
      }
      iVar3 = 0x10;
LAB_00104bd8:
      pcVar7 = pcVar7 + lVar4 + iVar2;
      for (iVar3 = iVar3 + -0x10; iVar3 != 0; iVar3 = iVar3 + 1) {
        *pcVar7 = ' ';
        pcVar7 = pcVar7 + 1;
      }
      pcVar7[0] = '\n';
      pcVar7[1] = '\0';
      _lws_log(hexdump_level,"%s",line);
      uVar1 = uVar1 + uVar6;
    }
    _lws_log(hexdump_level,"\n");
  }
  return;
}

Assistant:

void
lwsl_hexdump_level(int hexdump_level, const void *vbuf, size_t len)
{
	unsigned char *buf = (unsigned char *)vbuf;
	unsigned int n;

	if (!lwsl_visible(hexdump_level))
		return;

	if (!len) {
		_lws_log(hexdump_level, "(hexdump: zero length)\n");
		return;
	}

	if (!vbuf) {
		_lws_log(hexdump_level, "(hexdump: trying to dump %d at NULL)\n",
					(int)len);
		return;
	}

	_lws_log(hexdump_level, "\n");

	for (n = 0; n < len;) {
		unsigned int start = n, m;
		char line[80], *p = line;

		p += lws_snprintf(p, 10, "%04X: ", start);

		for (m = 0; m < 16 && n < len; m++)
			p += lws_snprintf(p, 5, "%02X ", buf[n++]);
		while (m++ < 16)
			p += lws_snprintf(p, 5, "   ");

		p += lws_snprintf(p, 6, "   ");

		for (m = 0; m < 16 && (start + m) < len; m++) {
			if (buf[start + m] >= ' ' && buf[start + m] < 127)
				*p++ = buf[start + m];
			else
				*p++ = '.';
		}
		while (m++ < 16)
			*p++ = ' ';

		*p++ = '\n';
		*p = '\0';
		_lws_log(hexdump_level, "%s", line);
		(void)line;
	}

	_lws_log(hexdump_level, "\n");
}